

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O2

ErrorMsgStream * __thiscall
spvtools::utils::(anonymous_namespace)::ErrorMsgStream::operator<<(ErrorMsgStream *this,char *val)

{
  if (*(ostream **)this != (ostream *)0x0) {
    std::operator<<(*(ostream **)this,val);
  }
  return (ErrorMsgStream *)this;
}

Assistant:

ErrorMsgStream& operator<<(T val) {
    if (stream_) *stream_ << val;
    return *this;
  }